

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O1

bool AM_clipMline(mline_t *ml,fline_t *fl)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  bool bVar19;
  double dVar20;
  
  dVar6 = m_x;
  dVar5 = scale_mtof;
  dVar1 = (ml->a).y;
  uVar9 = 8;
  uVar12 = 8;
  if ((dVar1 <= m_y2) && (uVar12 = 0, dVar1 < m_y)) {
    uVar12 = 4;
  }
  dVar2 = (ml->b).y;
  if ((dVar2 <= m_y2) && (uVar9 = 0, dVar2 < m_y)) {
    uVar9 = 4;
  }
  if ((uVar9 & uVar12) == 0) {
    dVar3 = (ml->a).x;
    if (m_x <= dVar3) {
      if (m_x2 < dVar3) {
        uVar12 = uVar12 | 2;
      }
    }
    else {
      uVar12 = uVar12 | 1;
    }
    dVar4 = (ml->b).x;
    if (m_x <= dVar4) {
      if (m_x2 < dVar4) {
        uVar9 = uVar9 | 2;
      }
    }
    else {
      uVar9 = uVar9 | 1;
    }
    if ((uVar9 & uVar12) == 0) {
      iVar13 = (int)((dVar3 - m_x) * scale_mtof);
      (fl->a).x = iVar13;
      iVar8 = f_h;
      dVar3 = m_y;
      lVar16 = (long)f_h;
      dVar20 = (double)f_h;
      iVar17 = (int)(dVar20 - (dVar1 - m_y) * dVar5);
      bVar19 = f_h <= iVar17;
      (fl->a).y = iVar17;
      iVar10 = (int)((dVar4 - dVar6) * dVar5);
      iVar14 = (int)(dVar20 - (dVar2 - dVar3) * dVar5);
      (fl->b).x = iVar10;
      (fl->b).y = iVar14;
      iVar7 = f_w;
      uVar9 = 8;
      if (-1 < iVar17) {
        uVar9 = (uint)bVar19 << 2;
      }
      if (iVar13 < 0) {
        uVar9 = uVar9 | 1;
      }
      else if (f_w <= iVar13) {
        uVar9 = uVar9 | 2;
      }
      uVar12 = 8;
      if (-1 < iVar14) {
        uVar12 = (uint)(iVar8 <= iVar14) << 2;
      }
      if (iVar10 < 0) {
        uVar12 = uVar12 | 1;
      }
      else if (f_w <= iVar10) {
        uVar12 = uVar12 | 2;
      }
      iVar10 = 0;
      if ((uVar12 & uVar9) != 0) {
        return false;
      }
      iVar13 = f_w + -1;
      iVar14 = 0;
      do {
        bVar19 = uVar12 == 0 && uVar9 == 0;
        if (bVar19) {
          return bVar19;
        }
        uVar15 = uVar9;
        if (uVar9 == 0) {
          uVar15 = uVar12;
        }
        if ((uVar15 & 8) == 0) {
          if ((uVar15 & 4) == 0) {
            if ((uVar15 & 2) == 0) {
              if ((uVar15 & 1) != 0) {
                iVar14 = (fl->a).y;
                lVar11 = (long)(fl->a).x;
                iVar10 = 0;
                iVar14 = (int)((-lVar11 * ((long)(fl->b).y - (long)iVar14)) / ((fl->b).x - lVar11))
                         + iVar14;
              }
            }
            else {
              iVar14 = (fl->a).y;
              uVar18 = (fl->a).x;
              iVar10 = iVar13;
              iVar14 = (int)(((long)(int)(~uVar18 + iVar7) * ((long)(fl->b).y - (long)iVar14)) /
                            ((long)(fl->b).x - (long)(int)uVar18)) + iVar14;
            }
          }
          else {
            lVar11 = (long)(fl->a).y;
            iVar10 = (fl->a).x;
            iVar10 = (int)(((lVar11 - lVar16) * ((long)(fl->b).x - (long)iVar10)) /
                          (lVar11 - (fl->b).y)) + iVar10;
            iVar14 = iVar8 + -1;
          }
        }
        else {
          lVar11 = (long)(fl->a).y;
          iVar10 = (fl->a).x;
          iVar10 = (int)((((long)(fl->b).x - (long)iVar10) * lVar11) / (lVar11 - (fl->b).y)) +
                   iVar10;
          iVar14 = 0;
        }
        uVar18 = 8;
        if (-1 < iVar14) {
          uVar18 = (uint)(iVar8 <= iVar14) << 2;
        }
        if (uVar15 == uVar9) {
          (fl->a).x = iVar10;
          (fl->a).y = iVar14;
          if (iVar10 < 0) {
            uVar9 = uVar18 | 1;
          }
          else {
            uVar9 = uVar18 | 2;
            if (iVar10 < iVar7) {
              uVar9 = uVar18;
            }
          }
        }
        else {
          (fl->b).x = iVar10;
          (fl->b).y = iVar14;
          if (iVar10 < 0) {
            uVar12 = uVar18 | 1;
          }
          else {
            uVar12 = uVar18 | 2;
            if (iVar10 < iVar7) {
              uVar12 = uVar18;
            }
          }
        }
      } while ((uVar12 & uVar9) == 0);
      return bVar19;
    }
  }
  return false;
}

Assistant:

bool AM_clipMline (mline_t *ml, fline_t *fl)
{
	enum {
		LEFT	=1,
		RIGHT	=2,
		BOTTOM	=4,
		TOP		=8
	};

	int outcode1 = 0;
	int outcode2 = 0;
	int outside;

	fpoint_t tmp = { 0, 0 };
	int dx;
	int dy;

#define DOOUTCODE(oc, mx, my) \
	(oc) = 0; \
	if ((my) < 0) (oc) |= TOP; \
	else if ((my) >= f_h) (oc) |= BOTTOM; \
	if ((mx) < 0) (oc) |= LEFT; \
	else if ((mx) >= f_w) (oc) |= RIGHT;

	// do trivial rejects and outcodes
	if (ml->a.y > m_y2)
		outcode1 = TOP;
	else if (ml->a.y < m_y)
		outcode1 = BOTTOM;

	if (ml->b.y > m_y2)
		outcode2 = TOP;
	else if (ml->b.y < m_y)
		outcode2 = BOTTOM;

	if (outcode1 & outcode2)
		return false; // trivially outside

	if (ml->a.x < m_x)
		outcode1 |= LEFT;
	else if (ml->a.x > m_x2)
		outcode1 |= RIGHT;

	if (ml->b.x < m_x)
		outcode2 |= LEFT;
	else if (ml->b.x > m_x2)
		outcode2 |= RIGHT;

	if (outcode1 & outcode2)
		return false; // trivially outside

	// transform to frame-buffer coordinates.
	fl->a.x = CXMTOF(ml->a.x);
	fl->a.y = CYMTOF(ml->a.y);
	fl->b.x = CXMTOF(ml->b.x);
	fl->b.y = CYMTOF(ml->b.y);

	DOOUTCODE(outcode1, fl->a.x, fl->a.y);
	DOOUTCODE(outcode2, fl->b.x, fl->b.y);

	if (outcode1 & outcode2)
		return false;

	while (outcode1 | outcode2) {
		// may be partially inside box
		// find an outside point
		if (outcode1)
			outside = outcode1;
		else
			outside = outcode2;
	
		// clip to each side
		if (outside & TOP)
		{
			dy = fl->a.y - fl->b.y;
			dx = fl->b.x - fl->a.x;
			tmp.x = fl->a.x + Scale(dx, fl->a.y, dy);
			tmp.y = 0;
		}
		else if (outside & BOTTOM)
		{
			dy = fl->a.y - fl->b.y;
			dx = fl->b.x - fl->a.x;
			tmp.x = fl->a.x + Scale(dx, fl->a.y - f_h, dy);
			tmp.y = f_h-1;
		}
		else if (outside & RIGHT)
		{
			dy = fl->b.y - fl->a.y;
			dx = fl->b.x - fl->a.x;
			tmp.y = fl->a.y + Scale(dy, f_w-1 - fl->a.x, dx);
			tmp.x = f_w-1;
		}
		else if (outside & LEFT)
		{
			dy = fl->b.y - fl->a.y;
			dx = fl->b.x - fl->a.x;
			tmp.y = fl->a.y + Scale(dy, -fl->a.x, dx);
			tmp.x = 0;
		}

		if (outside == outcode1)
		{
			fl->a = tmp;
			DOOUTCODE(outcode1, fl->a.x, fl->a.y);
		}
		else
		{
			fl->b = tmp;
			DOOUTCODE(outcode2, fl->b.x, fl->b.y);
		}
	
		if (outcode1 & outcode2)
			return false; // trivially outside
	}

	return true;
}